

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O3

void Imf_2_5::wav2Encode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  ushort *puVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  short bs_1;
  int iVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ushort *puVar16;
  ushort *puVar17;
  uint uVar18;
  uint uVar19;
  
  iVar3 = ny;
  if (nx < ny) {
    iVar3 = nx;
  }
  if (1 < iVar3) {
    uVar15 = 1;
    uVar7 = 2;
    do {
      iVar4 = (ny - uVar7) * oy;
      iVar5 = uVar15 * ox;
      puVar17 = in;
      if (-1 < iVar4) {
        iVar6 = uVar15 * oy;
        iVar8 = (nx - uVar7) * ox;
        do {
          puVar16 = puVar17;
          if (-1 < iVar8) {
            do {
              puVar1 = puVar16 + iVar6;
              uVar18 = (uint)(short)*puVar16;
              uVar2 = puVar16[iVar5];
              if (mx < 0x4000) {
                iVar9 = uVar18 - (int)(short)uVar2;
                iVar12 = (int)(short)*puVar1 - (int)(short)puVar1[iVar5];
                uVar18 = (int)(short)uVar2 + uVar18;
                uVar14 = (int)(short)puVar1[iVar5] + (int)(short)*puVar1;
                iVar11 = (uVar18 >> 1) - (uVar14 >> 1);
                uVar10 = (ushort)((uint)(((int)uVar14 >> 1) + ((int)uVar18 >> 1)) >> 1);
                uVar2 = (ushort)((uint)((int)(short)iVar12 + (int)(short)iVar9) >> 1);
                iVar9 = iVar9 - iVar12;
              }
              else {
                uVar14 = (uVar18 ^ 0x8000) & 0xffff;
                uVar19 = uVar14 - uVar2;
                uVar18 = (*puVar1 ^ 0x8000) - (uint)puVar1[iVar5];
                uVar13 = uVar18 >> 0x10 & 0x8000 ^ (uint)puVar1[iVar5] + (*puVar1 ^ 0x8000) >> 1;
                uVar14 = uVar2 + uVar14 >> 1 ^ 0x8000 ^ uVar19 >> 0x10 & 0x8000;
                iVar11 = uVar14 - uVar13;
                uVar10 = (ushort)((uint)iVar11 >> 0x10) & 0x8000 ^ (ushort)(uVar13 + uVar14 >> 1);
                uVar14 = uVar19 & 0xffff ^ 0x8000;
                uVar18 = uVar18 & 0xffff;
                iVar9 = uVar14 - uVar18;
                uVar2 = (ushort)((uint)iVar9 >> 0x10) & 0x8000 ^ (ushort)(uVar18 + uVar14 >> 1);
              }
              *puVar16 = uVar10;
              *puVar1 = (ushort)iVar11;
              puVar16[iVar5] = uVar2;
              puVar1[iVar5] = (ushort)iVar9;
              puVar16 = puVar16 + (int)(uVar7 * ox);
            } while (puVar16 <= puVar17 + iVar8);
          }
          if ((nx & uVar15) != 0) {
            uVar18 = (uint)(short)*puVar16;
            uVar2 = puVar16[iVar6];
            if (mx < 0x4000) {
              uVar10 = (ushort)((int)(short)uVar2 + uVar18 >> 1);
              iVar9 = uVar18 - (int)(short)uVar2;
            }
            else {
              uVar18 = (uVar18 ^ 0x8000) & 0xffff;
              iVar9 = uVar18 - uVar2;
              uVar10 = (ushort)((uint)iVar9 >> 0x10) & 0x8000 ^ (ushort)(uVar18 + uVar2 >> 1);
            }
            puVar16[iVar6] = (ushort)iVar9;
            *puVar16 = uVar10;
          }
          puVar17 = puVar17 + (int)(uVar7 * oy);
        } while (puVar17 <= in + iVar4);
      }
      if (((uVar15 & ny) != 0) && (iVar4 = (nx - uVar7) * ox, -1 < iVar4)) {
        puVar16 = puVar17 + iVar4;
        do {
          uVar15 = (uint)(short)*puVar17;
          uVar2 = puVar17[iVar5];
          if (mx < 0x4000) {
            uVar10 = (ushort)((int)(short)uVar2 + uVar15 >> 1);
            iVar4 = uVar15 - (int)(short)uVar2;
          }
          else {
            uVar15 = (uVar15 ^ 0x8000) & 0xffff;
            iVar4 = uVar15 - uVar2;
            uVar10 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^ (ushort)(uVar15 + uVar2 >> 1);
          }
          puVar17[iVar5] = (ushort)iVar4;
          *puVar17 = uVar10;
          puVar17 = puVar17 + (int)(uVar7 * ox);
        } while (puVar17 <= puVar16);
      }
      uVar18 = uVar7 * 2;
      uVar15 = uVar7;
      uVar7 = uVar18;
    } while ((int)uVar18 <= iVar3);
  }
  return;
}

Assistant:

void
wav2Encode
    (unsigned short*	in,	// io: values are transformed in place
     int		nx,	// i : x size
     int		ox,	// i : x offset
     int		ny,	// i : y size
     int		oy,	// i : y offset
     unsigned short	mx)	// i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int	n  = (nx > ny)? ny: nx;
    int	p  = 1;			// == 1 <<  level
    int p2 = 2;			// == 1 << (level+1)

    //
    // Hierachical loop on smaller dimension n
    //

    while (p2 <= n)
    {
	unsigned short *py = in;
	unsigned short *ey = in + oy * (ny - p2);
	int oy1 = oy * p;
	int oy2 = oy * p2;
	int ox1 = ox * p;
	int ox2 = ox * p2;
	unsigned short i00,i01,i10,i11;

	//
	// Y loop
	//

	for (; py <= ey; py += oy2)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    //
	    // X loop
	    //

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px  + ox1;
		unsigned short *p10 = px  + oy1;
		unsigned short *p11 = p10 + ox1;

		//
		// 2D wavelet encoding
		//

		if (w14)
		{
		    wenc14 (*px,  *p01, i00, i01);
		    wenc14 (*p10, *p11, i10, i11);
		    wenc14 (i00, i10, *px,  *p10);
		    wenc14 (i01, i11, *p01, *p11);
		}
		else
		{
		    wenc16 (*px,  *p01, i00, i01);
		    wenc16 (*p10, *p11, i10, i11);
		    wenc16 (i00, i10, *px,  *p10);
		    wenc16 (i01, i11, *p01, *p11);
		}
	    }

	    //
	    // Encode (1D) odd column (still in Y loop)
	    //

	    if (nx & p)
	    {
		unsigned short *p10 = px + oy1;

		if (w14)
		    wenc14 (*px, *p10, i00, *p10);
		else
		    wenc16 (*px, *p10, i00, *p10);

		*px= i00;
	    }
	}

	//
	// Encode (1D) odd line (must loop in X)
	//

	if (ny & p)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px + ox1;

		if (w14)
		    wenc14 (*px, *p01, i00, *p01);
		else
		    wenc16 (*px, *p01, i00, *p01);

		*px= i00;
	    }
	}

	//
	// Next level
	//

	p = p2;
	p2 <<= 1;
    }
}